

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::Error::Error(Error *this,string *name,string *msg,ExitCodes exit_code)

{
  string sStack_58;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,name);
  ::std::__cxx11::string::string((string *)&sStack_58,msg);
  Error(this,&local_38,&sStack_58,exit_code);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

Error(std::string name, std::string msg, ExitCodes exit_code) : Error(name, msg, static_cast<int>(exit_code)) {}